

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_sockets.c
# Opt level: O2

int mbedtls_net_bind(mbedtls_net_context *ctx,char *bind_ip,char *port,int proto)

{
  addrinfo *paVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  addrinfo **__pai;
  int n;
  addrinfo *addr_list;
  addrinfo local_68;
  
  net_prepare();
  local_68.ai_protocol = 6;
  if (proto == 1) {
    local_68.ai_protocol = 0x11;
  }
  local_68.ai_addrlen = 0;
  local_68._20_4_ = 0;
  local_68.ai_addr = (sockaddr *)0x0;
  local_68.ai_canonname = (char *)0x0;
  local_68.ai_next = (addrinfo *)0x0;
  local_68.ai_socktype = (proto == 1) + 1;
  local_68._1_7_ = 0;
  local_68.ai_flags._0_1_ = bind_ip == (char *)0x0;
  __pai = (addrinfo **)&addr_list;
  iVar2 = getaddrinfo(bind_ip,port,&local_68,__pai);
  iVar3 = -0x52;
  iVar4 = -0x52;
  if (iVar2 == 0) {
    while (iVar3 = iVar4, paVar1 = *__pai, paVar1 != (addrinfo *)0x0) {
      iVar3 = socket(paVar1->ai_family,paVar1->ai_socktype,paVar1->ai_protocol);
      ctx->fd = iVar3;
      iVar4 = -0x42;
      if (-1 < iVar3) {
        n = 1;
        iVar4 = setsockopt(iVar3,1,2,&n,4);
        iVar3 = ctx->fd;
        if (iVar4 == 0) {
          iVar3 = bind(iVar3,paVar1->ai_addr,paVar1->ai_addrlen);
          iVar4 = -0x46;
          if (iVar3 == 0) {
            iVar3 = 0;
            if (proto != 0) break;
            iVar2 = listen(ctx->fd,10);
            iVar4 = -0x48;
            if (iVar2 == 0) break;
          }
          iVar3 = ctx->fd;
        }
        else {
          iVar4 = -0x42;
        }
        close(iVar3);
      }
      __pai = &paVar1->ai_next;
    }
    freeaddrinfo((addrinfo *)addr_list);
  }
  return iVar3;
}

Assistant:

int mbedtls_net_bind( mbedtls_net_context *ctx, const char *bind_ip, const char *port, int proto )
{
    int n, ret;
    struct addrinfo hints, *addr_list, *cur;

    if( ( ret = net_prepare() ) != 0 )
        return( ret );

    /* Bind to IPv6 and/or IPv4, but only in the desired protocol */
    memset( &hints, 0, sizeof( hints ) );
    hints.ai_family = AF_UNSPEC;
    hints.ai_socktype = proto == MBEDTLS_NET_PROTO_UDP ? SOCK_DGRAM : SOCK_STREAM;
    hints.ai_protocol = proto == MBEDTLS_NET_PROTO_UDP ? IPPROTO_UDP : IPPROTO_TCP;
    if( bind_ip == NULL )
        hints.ai_flags = AI_PASSIVE;

    if( getaddrinfo( bind_ip, port, &hints, &addr_list ) != 0 )
        return( MBEDTLS_ERR_NET_UNKNOWN_HOST );

    /* Try the sockaddrs until a binding succeeds */
    ret = MBEDTLS_ERR_NET_UNKNOWN_HOST;
    for( cur = addr_list; cur != NULL; cur = cur->ai_next )
    {
        ctx->fd = (int) socket( cur->ai_family, cur->ai_socktype,
                            cur->ai_protocol );
        if( ctx->fd < 0 )
        {
            ret = MBEDTLS_ERR_NET_SOCKET_FAILED;
            continue;
        }

        n = 1;
        if( setsockopt( ctx->fd, SOL_SOCKET, SO_REUSEADDR,
                        (const char *) &n, sizeof( n ) ) != 0 )
        {
            close( ctx->fd );
            ret = MBEDTLS_ERR_NET_SOCKET_FAILED;
            continue;
        }

        if( bind( ctx->fd, cur->ai_addr, MSVC_INT_CAST cur->ai_addrlen ) != 0 )
        {
            close( ctx->fd );
            ret = MBEDTLS_ERR_NET_BIND_FAILED;
            continue;
        }

        /* Listen only makes sense for TCP */
        if( proto == MBEDTLS_NET_PROTO_TCP )
        {
            if( listen( ctx->fd, MBEDTLS_NET_LISTEN_BACKLOG ) != 0 )
            {
                close( ctx->fd );
                ret = MBEDTLS_ERR_NET_LISTEN_FAILED;
                continue;
            }
        }

        /* Bind was successful */
        ret = 0;
        break;
    }

    freeaddrinfo( addr_list );

    return( ret );

}